

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

int __thiscall smf::MidiEventList::linkNotePairsFIFO(MidiEventList *this)

{
  list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *this_00;
  uint uVar1;
  pointer ppMVar2;
  pointer plVar3;
  list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *plVar4;
  MidiEvent *this_01;
  pointer pvVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int i;
  long lVar11;
  vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  *noteon;
  pointer this_02;
  allocator_type local_c1;
  int local_c0;
  allocator_type local_b9;
  MidiEvent *mev;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  oldstates;
  value_type_conflict2 local_84;
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  contevents;
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  noteons;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> contmap;
  
  noteons.
  super__Vector_base<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noteons.
  super__Vector_base<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noteons.
  super__Vector_base<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
  ::resize(&noteons,0x10);
  pvVar5 = noteons.
           super__Vector_base<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = noteons.
                 super__Vector_base<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != pvVar5; this_02 = this_02 + 1
      ) {
    std::
    vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
    ::resize(this_02,0x80);
  }
  contevents.
  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&contmap,0x80,(value_type *)&contevents,(allocator_type *)&oldstates);
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x40].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x40].second = 0;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x41].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x41].second = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x42].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x42].second = 2;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x43].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x43].second = 3;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x44].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x44].second = 4;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x45].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x45].second = 5;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x50].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x50].second = 6;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x51].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x51].second = 7;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x52].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x52].second = 8;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x53].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x53].second = 9;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x54].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x54].second = 10;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x55].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x55].second = 0xb;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x56].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x56].second = 0xc;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x57].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x57].second = 0xd;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x58].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x58].second = 0xe;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x59].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x59].second = 0xf;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x5a].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x5a].second = 0x10;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x7a].first = 1;
  contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start[0x7a].second = 0x11;
  mev = (MidiEvent *)0x0;
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::vector
            ((vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&oldstates,0x10,&mev,
             (allocator_type *)&local_84);
  std::
  vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
  ::vector(&contevents,0x12,(value_type *)&oldstates,&local_c1);
  std::_Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::~_Vector_base
            ((_Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *)&oldstates);
  local_84 = -1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&mev,0x10,&local_84,(allocator_type *)&local_c1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&oldstates,0x12,(value_type *)&mev,&local_b9);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&mev);
  lVar11 = 0;
  iVar10 = 0;
  do {
    ppMVar2 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->list).
                            super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2) >> 3) <=
        lVar11) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&oldstates);
      std::
      vector<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
      ::~vector(&contevents);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&contmap.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::
      vector<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
      ::~vector(&noteons);
      return iVar10;
    }
    mev = ppMVar2[lVar11];
    MidiEvent::unlinkEvent(mev);
    bVar6 = MidiMessage::isNoteOn(&mev->super_MidiMessage);
    if (bVar6) {
      iVar7 = MidiMessage::getKeyNumber(&mev->super_MidiMessage);
      iVar8 = MidiMessage::getChannel(&mev->super_MidiMessage);
      std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back
                (noteons.
                 super__Vector_base<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar8].
                 super__Vector_base<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar7,(value_type *)&mev);
    }
    else {
      bVar6 = MidiMessage::isNoteOff(&mev->super_MidiMessage);
      if (bVar6) {
        iVar7 = MidiMessage::getKeyNumber(&mev->super_MidiMessage);
        iVar8 = MidiMessage::getChannel(&mev->super_MidiMessage);
        plVar3 = noteons.
                 super__Vector_base<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>,_std::allocator<std::vector<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar8].
                 super__Vector_base<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = plVar3 + iVar7;
        plVar4 = *(list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> **)
                  &plVar3[iVar7].
                   super__List_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                   _M_node;
        if (plVar4 != this_00) {
          this_01 = (MidiEvent *)
                    (plVar4->super__List_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>).
                    _M_impl._M_node._M_size;
          std::__cxx11::list<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::pop_front
                    (this_00);
          MidiEvent::linkEvent(this_01,mev);
          iVar10 = iVar10 + 1;
        }
      }
      else {
        bVar6 = MidiMessage::isController(&mev->super_MidiMessage);
        if (bVar6) {
          iVar7 = MidiMessage::getP1(&mev->super_MidiMessage);
          if (contmap.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar7].first != 0) {
            iVar7 = contmap.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar7].second;
            local_c0 = iVar10;
            iVar8 = MidiMessage::getChannel(&mev->super_MidiMessage);
            iVar9 = MidiMessage::getP2(&mev->super_MidiMessage);
            uVar1 = oldstates.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar8];
            iVar10 = local_c0;
            if ((iVar9 < 0x40) || (uVar1 != 0xffffffff)) {
              if (uVar1 != 0x3f < iVar9) {
                if ((0x3f < iVar9) && (uVar1 == 0)) goto LAB_00126183;
                if ((iVar9 < 0x40) && (uVar1 == 1)) {
                  MidiEvent::linkEvent
                            (contevents.
                             super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar7].
                             super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar8],mev);
                  oldstates.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[iVar8] = (uint)(0x3f < iVar9);
                  contevents.
                  super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7].
                  super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar8] = mev;
                  iVar10 = local_c0;
                }
              }
            }
            else {
LAB_00126183:
              contevents.
              super__Vector_base<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>,_std::allocator<std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar7].
              super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
              super__Vector_impl_data._M_start[iVar8] = mev;
              oldstates.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar7].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [iVar8] = 1;
            }
          }
        }
      }
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

int MidiEventList::linkNotePairsFIFO(void) {
	// Note-on states:
	// dimension 1: MIDI channel (0-15)
	// dimension 2: MIDI key     (0-127)  (but 0 not used for note-ons)
	// dimension 3: List of active note-ons or note-offs (FIFO behavior).
	std::vector<std::vector<std::list<MidiEvent*>>> noteons;
	noteons.resize(16);
	for (auto& noteon : noteons) {
		noteon.resize(128);
	}

	// Controller linking: The following General MIDI controller numbers are
	// also monitored for linking within the track (but not between tracks).
	// hex dec  name                                    range
	// 40  64   Hold pedal (Sustain) on/off             0..63=off  64..127=on
	// 41  65   Portamento on/off                       0..63=off  64..127=on
	// 42  66   Sustenuto Pedal on/off                  0..63=off  64..127=on
	// 43  67   Soft Pedal on/off                       0..63=off  64..127=on
	// 44  68   Legato Pedal on/off                     0..63=off  64..127=on
	// 45  69   Hold Pedal 2 on/off                     0..63=off  64..127=on
	// 50  80   General Purpose Button                  0..63=off  64..127=on
	// 51  81   General Purpose Button                  0..63=off  64..127=on
	// 52  82   General Purpose Button                  0..63=off  64..127=on
	// 53  83   General Purpose Button                  0..63=off  64..127=on
	// 54  84   Undefined on/off                        0..63=off  64..127=on
	// 55  85   Undefined on/off                        0..63=off  64..127=on
	// 56  86   Undefined on/off                        0..63=off  64..127=on
	// 57  87   Undefined on/off                        0..63=off  64..127=on
	// 58  88   Undefined on/off                        0..63=off  64..127=on
	// 59  89   Undefined on/off                        0..63=off  64..127=on
	// 5A  90   Undefined on/off                        0..63=off  64..127=on
	// 7A 122   Local Keyboard On/Off                   0..63=off  64..127=on

	// first keep track of whether the controller is an on/off switch:
	std::vector<std::pair<int, int>> contmap(128, {0, 0});
	contmap[64] = {1, 0}; contmap[65] = {1, 1}; contmap[66] = {1, 2}; 
	contmap[67] = {1, 3}; contmap[68] = {1, 4}; contmap[69] = {1, 5};
	contmap[80] = {1, 6}; contmap[81] = {1, 7}; contmap[82] = {1, 8}; 
	contmap[83] = {1, 9}; contmap[84] = {1, 10}; contmap[85] = {1, 11};
	contmap[86] = {1, 12}; contmap[87] = {1, 13}; contmap[88] = {1, 14}; 
	contmap[89] = {1, 15}; contmap[90] = {1, 16}; contmap[122] = {1, 17};

	std::vector<std::vector<MidiEvent*>> contevents(18, std::vector<MidiEvent*>(16, nullptr));
	std::vector<std::vector<int>> oldstates(18, std::vector<int>(16, -1));

	int counter = 0;
	for (int i = 0; i < getSize(); i++) {
		MidiEvent* mev = &getEvent(i);
		mev->unlinkEvent();

		if (mev->isNoteOn()) {
			int key = mev->getKeyNumber();
			int channel = mev->getChannel();
			noteons[channel][key].push_back(mev);  // Enqueue (FIFO)
		} else if (mev->isNoteOff()) {
			int key = mev->getKeyNumber();
			int channel = mev->getChannel();
			if (!noteons[channel][key].empty()) {  // **Check before accessing**
				MidiEvent* noteon = noteons[channel][key].front(); // Safely access first event
				noteons[channel][key].pop_front(); // Remove first event (FIFO)
				noteon->linkEvent(mev);
				counter++;
			}
		} else if (mev->isController()) {
			int contnum = mev->getP1();
			if (contmap[contnum].first) {
				int conti = contmap[contnum].second;
				int channel = mev->getChannel();
				int contval = mev->getP2();
				int contstate = contval < 64 ? 0 : 1;

				if ((oldstates[conti][channel] == -1) && contstate) {
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if (oldstates[conti][channel] == contstate) {
					// Redundant controller state, ignore.
				} else if ((oldstates[conti][channel] == 0) && contstate) {
					contevents[conti][channel] = mev;
					oldstates[conti][channel] = contstate;
				} else if ((oldstates[conti][channel] == 1) && (contstate == 0)) {
					contevents[conti][channel]->linkEvent(mev);
					oldstates[conti][channel] = contstate;
					contevents[conti][channel] = mev;
				}
			}
		}
	}
	return counter;
}